

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_model(V *values,int num_keys,LinearModel<int> *model,bool use_sampling)

{
  undefined7 in_register_00000009;
  ulong uVar1;
  LinearModelBuilder<int> local_98;
  
  if ((int)CONCAT71(in_register_00000009,use_sampling) != 0) {
    build_model_sampling(values,num_keys,model,false);
    return;
  }
  local_98.count_ = 0;
  local_98.x_sum_ = (longdouble)0;
  local_98.x_min_ = 0x7fffffff;
  local_98.x_max_ = -0x80000000;
  local_98.y_min_ = 1.79769313486232e+308;
  local_98.y_max_ = -1.79769313486232e+308;
  local_98.model_ = model;
  local_98.y_sum_ = local_98.x_sum_;
  local_98.xx_sum_ = local_98.x_sum_;
  local_98.xy_sum_ = local_98.x_sum_;
  for (uVar1 = 0; (uint)(~(num_keys >> 0x1f) & num_keys) != uVar1; uVar1 = uVar1 + 1) {
    LinearModelBuilder<int>::add(&local_98,values[uVar1].first,(int)uVar1);
  }
  LinearModelBuilder<int>::build(&local_98);
  return;
}

Assistant:

static void build_model(const V* values, int num_keys, LinearModel<T>* model,
                          bool use_sampling = false) {
    if (use_sampling) {
      build_model_sampling(values, num_keys, model);
      return;
    }

    LinearModelBuilder<T> builder(model);
    for (int i = 0; i < num_keys; i++) {
      builder.add(values[i].first, i);
    }
    builder.build();
  }